

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,SocketFactory *sf,io_context *io_context,uint16_t portNum,
          int nominalBufferSize)

{
  bool bVar1;
  unsigned_short local_26;
  tcp local_24;
  
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ioctx = io_context;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = sf->handshake_server;
  (this->socket_factory).encrypted = sf->encrypted;
  (this->socket_factory).handshake_server = bVar1;
  (this->accepting).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bufferSize = (long)nominalBufferSize;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->dataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dataCall).super__Function_base._M_functor + 8) = 0;
  (this->dataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dataCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->errorCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCall).super__Function_base._M_functor + 8) = 0;
  (this->errorCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logFunction).super__Function_base._M_functor + 8) = 0;
  (this->logFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logFunction)._M_invoker = (_Invoker_type)0x0;
  this->halted = (__atomic_base<bool>)0x0;
  this->reuse_address = false;
  std::
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
  ::emplace_back<asio::ip::tcp,unsigned_short&>
            ((vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
              *)&this->endpoints,&local_24,&local_26);
  initialConnect(this);
  return;
}

Assistant:

TcpServer::TcpServer(
    const SocketFactory& sf,
    asio::io_context& io_context,
    uint16_t portNum,
    int nominalBufferSize) :
    ioctx(io_context), socket_factory(sf), bufferSize(nominalBufferSize)
{
    endpoints.emplace_back(asio::ip::tcp::v4(), portNum);
    initialConnect();
}